

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

string * __thiscall
perfetto::protos::gen::TracingServiceState_Producer::SerializeAsString_abi_cxx11_
          (string *__return_storage_ptr__,TracingServiceState_Producer *this)

{
  HeapBuffered<protozero::Message> msg;
  HeapBuffered<protozero::Message> local_d0;
  
  protozero::HeapBuffered<protozero::Message>::HeapBuffered(&local_d0);
  Serialize(this,&local_d0.msg_.super_Message);
  protozero::HeapBuffered<protozero::Message>::SerializeAsString_abi_cxx11_
            (__return_storage_ptr__,&local_d0);
  protozero::MessageArena::~MessageArena(&local_d0.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_d0.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_d0.shb_);
  return __return_storage_ptr__;
}

Assistant:

std::string TracingServiceState_Producer::SerializeAsString() const {
  ::protozero::HeapBuffered<::protozero::Message> msg;
  Serialize(msg.get());
  return msg.SerializeAsString();
}